

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O3

int mbedtls_cipher_set_iv(mbedtls_cipher_context_t *ctx,uchar *iv,size_t iv_len)

{
  mbedtls_cipher_info_t *pmVar1;
  int iVar2;
  size_t __n;
  
  pmVar1 = ctx->cipher_info;
  if (pmVar1 != (mbedtls_cipher_info_t *)0x0) {
    if (0x10 < iv_len) {
      return -0x6080;
    }
    __n = iv_len;
    if (((pmVar1->flags & 1) != 0) || (__n = (size_t)pmVar1->iv_size, __n <= iv_len)) {
      if ((pmVar1->type == MBEDTLS_CIPHER_CHACHA20) &&
         (iVar2 = mbedtls_chacha20_starts((mbedtls_chacha20_context *)ctx->cipher_ctx,iv,0),
         iVar2 != 0)) {
        return -0x6100;
      }
      if (__n == 0) {
        return 0;
      }
      memcpy(ctx->iv,iv,__n);
      ctx->iv_size = __n;
      return 0;
    }
  }
  return -0x6100;
}

Assistant:

int mbedtls_cipher_set_iv( mbedtls_cipher_context_t *ctx,
                           const unsigned char *iv,
                           size_t iv_len )
{
    size_t actual_iv_size;

    CIPHER_VALIDATE_RET( ctx != NULL );
    CIPHER_VALIDATE_RET( iv_len == 0 || iv != NULL );
    if( ctx->cipher_info == NULL )
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );
#if defined(MBEDTLS_USE_PSA_CRYPTO)
    if( ctx->psa_enabled == 1 )
    {
        /* While PSA Crypto has an API for multipart
         * operations, we currently don't make it
         * accessible through the cipher layer. */
        return( MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE );
    }
#endif /* MBEDTLS_USE_PSA_CRYPTO */

    /* avoid buffer overflow in ctx->iv */
    if( iv_len > MBEDTLS_MAX_IV_LENGTH )
        return( MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE );

    if( ( ctx->cipher_info->flags & MBEDTLS_CIPHER_VARIABLE_IV_LEN ) != 0 )
        actual_iv_size = iv_len;
    else
    {
        actual_iv_size = ctx->cipher_info->iv_size;

        /* avoid reading past the end of input buffer */
        if( actual_iv_size > iv_len )
            return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );
    }

#if defined(MBEDTLS_CHACHA20_C)
    if ( ctx->cipher_info->type == MBEDTLS_CIPHER_CHACHA20 )
    {
        if ( 0 != mbedtls_chacha20_starts( (mbedtls_chacha20_context*)ctx->cipher_ctx,
                                           iv,
                                           0U ) ) /* Initial counter value */
        {
            return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );
        }
    }
#endif

    if ( actual_iv_size != 0 )
    {
        memcpy( ctx->iv, iv, actual_iv_size );
        ctx->iv_size = actual_iv_size;
    }

    return( 0 );
}